

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O0

void __thiscall
yamc::fair::detail::shared_mutex_base<yamc::rwlock::TaskFairness>::impl_unlock
          (shared_mutex_base<yamc::rwlock::TaskFairness> *this)

{
  bool bVar1;
  shared_mutex_base<yamc::rwlock::TaskFairness> *local_18;
  node *p;
  shared_mutex_base<yamc::rwlock::TaskFairness> *this_local;
  
  bVar1 = false;
  if ((this->queue_).next == &this->locked_) {
    bVar1 = ((this->locked_).status & 3) == 2;
  }
  if (bVar1) {
    wq_pop_locknode(this);
    bVar1 = wq_empty(this);
    if (!bVar1) {
      local_18 = (shared_mutex_base<yamc::rwlock::TaskFairness> *)(this->queue_).next;
      while( true ) {
        bVar1 = false;
        if (local_18 != this) {
          bVar1 = ((local_18->queue_).status & 3) == 1;
        }
        if (!bVar1) break;
        (local_18->queue_).status = (local_18->queue_).status | 2;
        local_18 = (shared_mutex_base<yamc::rwlock::TaskFairness> *)(local_18->queue_).next;
      }
    }
    std::condition_variable::notify_all();
    return;
  }
  __assert_fail("queue_.next == &locked_ && (locked_.status & node_status_mask) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_shared_mutex.hpp"
                ,0xe9,
                "void yamc::fair::detail::shared_mutex_base<yamc::rwlock::TaskFairness>::impl_unlock() [RwLockFairness = yamc::rwlock::TaskFairness]"
               );
}

Assistant:

void impl_unlock()
  {
    YAMC_DEBUG_DUMPQ(">>unlock", &locked_, -1);
    assert(queue_.next == &locked_ && (locked_.status & node_status_mask) == 2);
    wq_pop_locknode();
    if (!wq_empty()) {
      // mark subsequent shared-lock nodes as 'lockable'
      if (RwLockFairness::phased) {
        //
        // PhaseFairness: move up to the front and mark all shared-lock nodes,
        // when next phase is shared-lock.
        //
        if ((queue_.next->status & node_status_mask) == 1) {
          node sentinel = {~std::size_t(0), 0, 0};
          wq_push_back(&sentinel);
          node* p = queue_.next;
          while (p != &sentinel) {
            node* next = p->next;
            if ((p->status & node_status_mask) == 0) {
              wq_erase(p);
              wq_push_back(p);
            } else {
              assert((p->status & node_status_mask) == 1);
              p->status |= 2;
            }
            p = next;
          }
          wq_erase(&sentinel);
        }
      } else {
        //
        // TaskFairness: mark directly subsequent shared-lock nodes group.
        //
        node* p = queue_.next;
        while (p != &queue_ && (p->status & node_status_mask) == 1) {
          p->status |= 2;
          p = p->next;
        }
      }
    }
    cv_.notify_all();
    YAMC_DEBUG_DUMPQ("<<unlock");
  }